

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.cpp
# Opt level: O3

void embree::storeSTB(Ref<embree::Image> *img,FileName *fileName)

{
  ulong uVar1;
  ulong uVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  runtime_error *this;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  Color4 c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  string ext;
  undefined1 local_98 [8];
  float local_90;
  char local_88 [16];
  ulong local_78;
  FileName *local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  string local_50;
  
  FileName::ext_abi_cxx11_((string *)local_98,fileName);
  toLowerCase(&local_50,(string *)local_98);
  if (local_98 != (undefined1  [8])local_88) {
    operator_delete((void *)local_98);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar4 != 0) {
    iVar4 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar4 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar4 != 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Could not store image");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  uVar1 = img->ptr->width;
  uVar2 = img->ptr->height;
  iVar4 = (int)uVar1;
  local_70 = fileName;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_68,(long)(((ulong)(uint)(iVar4 * (int)uVar2) << 0x20) * 3) >> 0x20,
             (allocator_type *)local_98);
  local_78 = uVar2;
  if (0 < (int)uVar2) {
    uVar7 = 0;
    do {
      if (0 < iVar4) {
        uVar6 = 0;
        do {
          (*(img->ptr->super_RefCount)._vptr_RefCount[4])(local_98,img->ptr,uVar6,uVar7);
          fVar8 = (float)local_98._0_4_;
          if (1.0 <= (float)local_98._0_4_) {
            fVar8 = 1.0;
          }
          fVar9 = 0.0;
          if (0.0 <= fVar8) {
            fVar9 = fVar8;
          }
          local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[(img->ptr->width * uVar7 + uVar6) * 3] =
               (uchar)(int)(fVar9 * 255.0);
          fVar8 = (float)local_98._4_4_;
          if (1.0 <= (float)local_98._4_4_) {
            fVar8 = 1.0;
          }
          fVar9 = 0.0;
          if (0.0 <= fVar8) {
            fVar9 = fVar8;
          }
          local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[(img->ptr->width * uVar7 + uVar6) * 3 + 1] =
               (uchar)(int)(fVar9 * 255.0);
          fVar8 = local_90;
          if (1.0 <= local_90) {
            fVar8 = 1.0;
          }
          fVar9 = 0.0;
          if (0.0 <= fVar8) {
            fVar9 = fVar8;
          }
          local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[(img->ptr->width * uVar7 + uVar6) * 3 + 2] =
               (uchar)(int)(fVar9 * 255.0);
          uVar6 = uVar6 + 1;
        } while ((uVar1 & 0x7fffffff) != uVar6);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uVar2 & 0x7fffffff));
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar5 == 0) {
    local_98 = (undefined1  [8])local_88;
    pcVar3 = (local_70->filename)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,pcVar3,pcVar3 + (local_70->filename)._M_string_length);
    stbi_write_bmp((char *)local_98,iVar4,(int)local_78,3,
                   local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar5 == 0) {
      pcVar3 = (local_70->filename)._M_dataplus._M_p;
      local_98 = (undefined1  [8])local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar3,pcVar3 + (local_70->filename)._M_string_length);
      stbi_write_png((char *)local_98,iVar4,(int)local_78,3,
                     local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,iVar4 * 3);
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar5 != 0) goto LAB_001b4f0b;
      pcVar3 = (local_70->filename)._M_dataplus._M_p;
      local_98 = (undefined1  [8])local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar3,pcVar3 + (local_70->filename)._M_string_length);
      stbi_write_jpg((char *)local_98,iVar4,(int)local_78,3,
                     local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,100);
    }
  }
  if (local_98 != (undefined1  [8])local_88) {
    operator_delete((void *)local_98);
  }
LAB_001b4f0b:
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void storeSTB(const Ref<Image>& img, const FileName& fileName)
  {
    std::string ext = toLowerCase(fileName.ext());
    if (ext != "bmp" && ext != "png" && ext != "jpg") {
        THROW_RUNTIME_ERROR("Could not store image")
        return;
    }

    int width = int(img->width);
    int height = int(img->height);
    int channels = 3;
    std::vector<unsigned char> pixels(width*height*channels);
    const float maxColor = 255.f;
    for (int y = 0; y < height; y++)
    {
      for (int x = 0; x < width; x++)
      {
        Color4 c = img->get(x, y);
        pixels[(y*img->width+x)*channels+0] = (unsigned char)(clamp(c.r) * maxColor);
        pixels[(y*img->width+x)*channels+1] = (unsigned char)(clamp(c.g) * maxColor);
        pixels[(y*img->width+x)*channels+2] = (unsigned char)(clamp(c.b) * maxColor);
      }
    }

    if (ext == "bmp" ) { stbi_write_bmp(fileName.str().c_str(), width, height, channels, pixels.data());                    return; }
    if (ext == "png" ) { stbi_write_png(fileName.str().c_str(), width, height, channels, pixels.data(), width * channels);  return; }
    if (ext == "jpg" ) { stbi_write_jpg(fileName.str().c_str(), width, height, channels, pixels.data(), 100);               return; }
  }